

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressBegin_usingDict(ZSTD_DCtx *dctx,void *dict,size_t dictSize)

{
  size_t sVar1;
  void *pvVar2;
  
  dctx->expected = (ulong)(dctx->format != ZSTD_f_zstd1_magicless) * 4 + 1;
  dctx->stage = ZSTDds_getFrameHeaderSize;
  dctx->decodedSize = 0;
  dctx->previousDstEnd = (void *)0x0;
  dctx->prefixStart = (void *)0x0;
  dctx->virtualStart = (void *)0x0;
  dctx->dictEnd = (void *)0x0;
  (dctx->entropy).hufTable[0] = 0xc00000c;
  dctx->litEntropy = 0;
  dctx->fseEntropy = 0;
  dctx->dictID = 0;
  (dctx->entropy).rep[0] = 1;
  (dctx->entropy).rep[1] = 4;
  (dctx->entropy).rep[2] = 8;
  dctx->LLTptr = (dctx->entropy).LLTable;
  dctx->MLTptr = (dctx->entropy).MLTable;
  dctx->OFTptr = (dctx->entropy).OFTable;
  dctx->HUFptr = (dctx->entropy).hufTable;
  if (dictSize != 0 && dict != (void *)0x0) {
    pvVar2 = dict;
    if ((7 < dictSize) && (*dict == -0x13cf5bc9)) {
      dctx->dictID = *(U32 *)((long)dict + 4);
      sVar1 = ZSTD_loadDEntropy(&dctx->entropy,dict,dictSize);
      if (0xffffffffffffff88 < sVar1) {
        return 0xffffffffffffffe2;
      }
      pvVar2 = (void *)(sVar1 + (long)dict);
      dctx->litEntropy = 1;
      dctx->fseEntropy = 1;
    }
    dctx->dictEnd = dctx->previousDstEnd;
    dctx->virtualStart =
         (void *)(((long)dctx->prefixStart - (long)dctx->previousDstEnd) + (long)pvVar2);
    dctx->prefixStart = pvVar2;
    dctx->previousDstEnd = (void *)((long)dict + dictSize);
  }
  return 0;
}

Assistant:

size_t ZSTD_decompressBegin_usingDict(ZSTD_DCtx* dctx, const void* dict, size_t dictSize)
{
    FORWARD_IF_ERROR( ZSTD_decompressBegin(dctx) );
    if (dict && dictSize)
        RETURN_ERROR_IF(
            ZSTD_isError(ZSTD_decompress_insertDictionary(dctx, dict, dictSize)),
            dictionary_corrupted);
    return 0;
}